

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,char *codepageData,int32_t dataLength)

{
  size_t sVar1;
  undefined4 in_register_00000014;
  StringPiece utf8;
  
  sVar1 = CONCAT44(in_register_00000014,dataLength);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003d8fe8
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if (((-2 < dataLength) && (codepageData != (char *)0x0)) && (dataLength != 0)) {
    if (dataLength == -1) {
      sVar1 = strlen(codepageData);
    }
    utf8._8_8_ = sVar1;
    utf8.ptr_ = codepageData;
    setToUTF8(this,utf8);
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(const char *codepageData, int32_t dataLength) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  // if there's nothing to convert, do nothing
  if(codepageData == 0 || dataLength == 0 || dataLength < -1) {
    return;
  }
  if(dataLength == -1) {
    dataLength = (int32_t)uprv_strlen(codepageData);
  }
  setToUTF8(StringPiece(codepageData, dataLength));
}